

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ProgramBinaryUniformResetCase::test(ProgramBinaryUniformResetCase *this)

{
  bool bVar1;
  deBool dVar2;
  deUint32 dVar3;
  TestLog *log_00;
  RenderContext *pRVar4;
  TestError *this_00;
  MessageBuilder *this_01;
  MessageBuilder local_3a8;
  undefined1 local_228 [8];
  ProgramBinary binary;
  ShaderProgram program;
  ProgramSources sources;
  undefined1 local_58 [8];
  string fragSrc;
  string vertSrc;
  TestLog *log;
  ProgramBinaryUniformResetCase *this_local;
  
  log_00 = tcu::TestContext::getLog
                     ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  getShaderSource_abi_cxx11_((string *)((long)&fragSrc.field_2 + 8),this,SHADERTYPE_VERTEX);
  getShaderSource_abi_cxx11_((string *)local_58,this,SHADERTYPE_FRAGMENT);
  glu::makeVtxFragSources
            ((ProgramSources *)&program.m_program.m_info.linkTimeUs,
             (string *)((long)&fragSrc.field_2 + 8),(string *)local_58);
  pRVar4 = gles3::Context::getRenderContext
                     ((this->super_ProgramBinaryCase).super_TestCase.m_context);
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)
             &binary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pRVar4,
             (ProgramSources *)&program.m_program.m_info.linkTimeUs);
  glu::operator<<(log_00,(ShaderProgram *)
                         &binary.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    dVar2 = ::deGetFalse();
    if (dVar2 != 0) break;
    bVar1 = glu::ShaderProgram::isOk
                      ((ShaderProgram *)
                       &binary.data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      Functional::anon_unknown_0::ProgramBinary::ProgramBinary((ProgramBinary *)local_228);
      dVar3 = glu::ShaderProgram::getProgram
                        ((ShaderProgram *)
                         &binary.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      ProgramBinaryCase::getProgramBinary
                (&this->super_ProgramBinaryCase,(ProgramBinary *)local_228,dVar3);
      ProgramBinaryCase::verifyProgramBinary
                (&this->super_ProgramBinaryCase,(ProgramBinary *)local_228);
      setUniformsRandom(this,(ShaderProgram *)
                             &binary.data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
      tcu::TestLog::operator<<(&local_3a8,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
      this_01 = tcu::MessageBuilder::operator<<
                          (&local_3a8,(char (*) [42])"Rendering test image and reloading binary");
      tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3a8);
      pRVar4 = gles3::Context::getRenderContext
                         ((this->super_ProgramBinaryCase).super_TestCase.m_context);
      dVar3 = glu::ShaderProgram::getProgram
                        ((ShaderProgram *)
                         &binary.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      Functional::anon_unknown_0::drawWithProgram(pRVar4,dVar3);
      dVar3 = glu::ShaderProgram::getProgram
                        ((ShaderProgram *)
                         &binary.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      ProgramBinaryCase::loadProgramBinary
                (&this->super_ProgramBinaryCase,(ProgramBinary *)local_228,dVar3);
      verifyUniformsReset(this,(ShaderProgram *)
                               &binary.data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
      Functional::anon_unknown_0::ProgramBinary::~ProgramBinary((ProgramBinary *)local_228);
      glu::ShaderProgram::~ShaderProgram
                ((ShaderProgram *)
                 &binary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      glu::ProgramSources::~ProgramSources((ProgramSources *)&program.m_program.m_info.linkTimeUs);
      std::__cxx11::string::~string((string *)local_58);
      std::__cxx11::string::~string((string *)(fragSrc.field_2._M_local_buf + 8));
      return;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Couldn\'t build program","program.isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderApiTests.cpp"
             ,0x557);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void test (void)
	{
		TestLog&					log		= m_testCtx.getLog();

		const std::string			vertSrc	= getShaderSource(glu::SHADERTYPE_VERTEX);
		const std::string			fragSrc	= getShaderSource(glu::SHADERTYPE_FRAGMENT);

		const glu::ProgramSources	sources	= glu::makeVtxFragSources(vertSrc, fragSrc);

		glu::ShaderProgram			program	(m_context.getRenderContext(), sources);

		log << program;

		TCU_CHECK_MSG(program.isOk(), "Couldn't build program");

		{
			ProgramBinary binary;

			getProgramBinary(binary, program.getProgram());
			verifyProgramBinary(binary);

			setUniformsRandom(program);

			log << TestLog::Message << "Rendering test image and reloading binary" << TestLog::EndMessage;

			drawWithProgram(m_context.getRenderContext(), program.getProgram());
			loadProgramBinary(binary, program.getProgram());

			verifyUniformsReset(program);
		}
	}